

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowing(void)

{
  bool bVar1;
  ImGuiNavLayer IVar2;
  ImGuiInputSource IVar3;
  float fVar4;
  ImGuiNavLayer new_nav_layer;
  ImGuiWindow *old_nav_window;
  ImGuiWindow *new_nav_window;
  ImGuiWindow *moving_window;
  float move_speed;
  float NAV_MOVE_SPEED;
  ImVec2 move_delta;
  bool nav_keyboard_active;
  int focus_change_dir;
  ImGuiWindow *window;
  bool start_windowing_with_keyboard;
  bool start_windowing_with_gamepad;
  bool allow_windowing;
  ImGuiWindow *modal_window;
  bool apply_toggle_layer;
  ImGuiWindow *apply_focus_window;
  ImGuiIO *io;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 uVar5;
  undefined8 in_stack_ffffffffffffff50;
  ImGuiWindow *pIVar6;
  uint in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  ImGuiWindow *in_stack_ffffffffffffff68;
  undefined1 force_reinit;
  undefined2 in_stack_ffffffffffffff70;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff80;
  ImGuiWindow *pIVar9;
  undefined8 in_stack_ffffffffffffff88;
  ImVec2 local_48;
  undefined1 local_3d;
  int local_3c;
  ImGuiWindow *local_38;
  byte local_2b;
  byte local_2a;
  byte local_29;
  ImGuiWindow *local_28;
  byte local_19;
  ImGuiWindow *local_18;
  ImGuiIO *local_10;
  ImGuiContext *local_8;
  ImGuiCond cond;
  
  local_8 = GImGui;
  local_10 = &GImGui->IO;
  local_18 = (ImGuiWindow *)0x0;
  local_19 = 0;
  local_28 = GetTopMostPopupModal();
  local_29 = local_28 == (ImGuiWindow *)0x0;
  if (!(bool)local_29) {
    local_8->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((local_8->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (local_8->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar4 = ImMax<float>(-local_10->DeltaTime * 10.0 + local_8->NavWindowingHighlightAlpha,0.0);
    local_8->NavWindowingHighlightAlpha = fVar4;
    if ((local_8->DimBgRatio <= 0.0) && (local_8->NavWindowingHighlightAlpha <= 0.0)) {
      local_8->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  uVar8 = false;
  if (((local_29 & 1) != 0) && (uVar8 = false, local_8->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    uVar8 = IsNavInputTest(0,0x13eb1f);
  }
  uVar7 = false;
  local_2a = uVar8;
  if ((((local_29 & 1) != 0) && (uVar7 = false, local_8->NavWindowingTarget == (ImGuiWindow *)0x0))
     && (uVar7 = false, (local_10->KeyCtrl & 1U) != 0)) {
    uVar7 = IsKeyPressed((ImGuiKey)in_stack_ffffffffffffff50,
                         SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  }
  local_2b = uVar7;
  if (((local_2a & 1) != 0) || ((bool)uVar7 != false)) {
    if (local_8->NavWindow == (ImGuiWindow *)0x0) {
      in_stack_ffffffffffffff68 =
           FindWindowNavFocusable
                     ((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48
                      ,(int)in_stack_ffffffffffffff44);
    }
    else {
      in_stack_ffffffffffffff68 = local_8->NavWindow;
    }
    local_38 = in_stack_ffffffffffffff68;
    if (in_stack_ffffffffffffff68 != (ImGuiWindow *)0x0) {
      pIVar9 = in_stack_ffffffffffffff68->RootWindow;
      local_8->NavWindowingTargetAnim = pIVar9;
      local_8->NavWindowingTarget = pIVar9;
      local_8->NavWindowingHighlightAlpha = 0.0;
      local_8->NavWindowingTimer = 0.0;
      local_8->NavWindowingToggleLayer = (bool)(-(local_2a & 1) & 1);
      IVar3 = ImGuiInputSource_Gamepad;
      if ((local_2b & 1) != 0) {
        IVar3 = ImGuiInputSource_Keyboard;
      }
      local_8->NavInputSource = IVar3;
    }
  }
  force_reinit = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  uVar5 = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  local_8->NavWindowingTimer = local_10->DeltaTime + local_8->NavWindowingTimer;
  if ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (local_8->NavInputSource == ImGuiInputSource_Gamepad)) {
    in_stack_ffffffffffffff60 = local_8->NavWindowingHighlightAlpha;
    fVar4 = ImSaturate((local_8->NavWindowingTimer - 0.2) / 0.05);
    fVar4 = ImMax<float>(in_stack_ffffffffffffff60,fVar4);
    local_8->NavWindowingHighlightAlpha = fVar4;
    bVar1 = IsNavInputTest(0,0x13ed65);
    in_stack_ffffffffffffff64 = (uint)bVar1;
    bVar1 = IsNavInputTest(0,0x13ed7d);
    local_3c = in_stack_ffffffffffffff64 - bVar1;
    if (local_3c != 0) {
      NavUpdateWindowingHighlightWindow((int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      local_8->NavWindowingHighlightAlpha = 1.0;
    }
    bVar1 = IsNavInputDown(3);
    if (!bVar1) {
      local_8->NavWindowingToggleLayer =
           (local_8->NavWindowingToggleLayer & 1U &
           (local_8->NavWindowingHighlightAlpha <= 1.0 && local_8->NavWindowingHighlightAlpha != 1.0
           )) != 0;
      if (((local_8->NavWindowingToggleLayer & 1U) == 0) ||
         (local_8->NavWindow == (ImGuiWindow *)0x0)) {
        if ((local_8->NavWindowingToggleLayer & 1U) == 0) {
          local_18 = local_8->NavWindowingTarget;
        }
      }
      else {
        local_19 = 1;
      }
      local_8->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
  }
  if ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (local_8->NavInputSource == ImGuiInputSource_Keyboard)) {
    in_stack_ffffffffffffff5c = local_8->NavWindowingHighlightAlpha;
    fVar4 = ImSaturate((local_8->NavWindowingTimer - 0.2) / 0.05);
    fVar4 = ImMax<float>(in_stack_ffffffffffffff5c,fVar4);
    local_8->NavWindowingHighlightAlpha = fVar4;
    bVar1 = IsKeyPressed((ImGuiKey)in_stack_ffffffffffffff50,(bool)uVar5);
    if (bVar1) {
      NavUpdateWindowingHighlightWindow((int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    }
    if ((local_10->KeyCtrl & 1U) == 0) {
      local_18 = local_8->NavWindowingTarget;
    }
  }
  local_3d = (local_10->ConfigFlags & 1U) != 0;
  if (((bool)local_3d) &&
     (bVar1 = IsKeyPressed((ImGuiKey)in_stack_ffffffffffffff50,(bool)uVar5), bVar1)) {
    local_8->NavWindowingToggleLayer = true;
    local_8->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if (((local_8->NavWindowingToggleLayer & 1U) != 0) &&
     (local_8->NavInputSource == ImGuiInputSource_Keyboard)) {
    if ((0 < (local_10->InputQueueCharacters).Size) ||
       ((((local_10->KeyCtrl & 1U) != 0 || ((local_10->KeyShift & 1U) != 0)) ||
        ((local_10->KeySuper & 1U) != 0)))) {
      local_8->NavWindowingToggleLayer = false;
    }
    bVar1 = IsKeyReleased((ImGuiKey)in_stack_ffffffffffffff44);
    if (((bVar1) && ((local_8->NavWindowingToggleLayer & 1U) != 0)) &&
       ((local_8->ActiveId == 0 || ((local_8->ActiveIdAllowOverlap & 1U) != 0)))) {
      bVar1 = IsMousePosValid(&local_10->MousePos);
      in_stack_ffffffffffffff58 = (uint)bVar1;
      bVar1 = IsMousePosValid(&local_10->MousePosPrev);
      if (in_stack_ffffffffffffff58 == bVar1) {
        local_19 = 1;
      }
    }
    bVar1 = IsKeyDown((ImGuiKey)in_stack_ffffffffffffff44);
    if (!bVar1) {
      local_8->NavWindowingToggleLayer = false;
    }
  }
  if ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     ((local_8->NavWindowingTarget->Flags & 4U) == 0)) {
    ImVec2::ImVec2(&local_48);
    if ((local_8->NavInputSource == ImGuiInputSource_Keyboard) && ((local_10->KeyShift & 1U) == 0))
    {
      local_48 = GetNavInputAmount2d((ImGuiNavDirSourceFlags)
                                     ((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                     (ImGuiInputReadMode)in_stack_ffffffffffffff88,
                                     (float)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                     (float)in_stack_ffffffffffffff80);
    }
    if (local_8->NavInputSource == ImGuiInputSource_Gamepad) {
      local_48 = GetNavInputAmount2d((ImGuiNavDirSourceFlags)
                                     ((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                     (ImGuiInputReadMode)in_stack_ffffffffffffff88,
                                     (float)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                     (float)in_stack_ffffffffffffff80);
    }
    if ((local_48.x == 0.0) && (!NAN(local_48.x))) {
      if ((local_48.y == 0.0) && (!NAN(local_48.y))) goto LAB_0013f2bd;
    }
    in_stack_ffffffffffffff44 = local_10->DeltaTime * 800.0;
    fVar4 = ImMin<float>((local_10->DisplayFramebufferScale).x,(local_10->DisplayFramebufferScale).y
                        );
    ImFloor(in_stack_ffffffffffffff44 * fVar4);
    pIVar9 = local_8->NavWindowingTarget->RootWindow;
    pIVar6 = pIVar9;
    operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0.0);
    cond = (ImGuiCond)((ulong)pIVar6 >> 0x20);
    operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
              (ImVec2 *)0x13f288);
    SetWindowPos((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),cond);
    MarkIniSettingsDirty(pIVar9);
    local_8->NavDisableMouseHover = true;
  }
LAB_0013f2bd:
  uVar5 = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18);
  if ((local_18 != (ImGuiWindow *)0x0) &&
     ((local_8->NavWindow == (ImGuiWindow *)0x0 || (local_18 != local_8->NavWindow->RootWindow)))) {
    ClearActiveID();
    NavRestoreHighlightAfterMove();
    local_18 = NavRestoreLastChildNavWindow(local_18);
    ClosePopupsOverWindow
              ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (bool)uVar5);
    FocusWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (local_18->NavLastIds[0] == 0) {
      NavInitWindow((ImGuiWindow *)
                    CONCAT44(in_stack_ffffffffffffff74,
                             CONCAT13(uVar8,CONCAT12(uVar7,in_stack_ffffffffffffff70))),
                    (bool)force_reinit);
    }
    if ((local_18->DC).NavLayersActiveMaskNext == 2) {
      local_8->NavLayer = ImGuiNavLayer_Menu;
    }
  }
  if (local_18 != (ImGuiWindow *)0x0) {
    local_8->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((local_19 & 1) != 0) && (local_8->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    pIVar9 = local_8->NavWindow;
    while( true ) {
      bVar1 = false;
      if (((pIVar9->ParentWindow != (ImGuiWindow *)0x0) &&
          (bVar1 = false, ((pIVar9->DC).NavLayersActiveMask & 2U) == 0)) &&
         (bVar1 = false, (pIVar9->Flags & 0x1000000U) != 0)) {
        bVar1 = (pIVar9->Flags & 0x14000000U) == 0;
      }
      if (!bVar1) break;
      pIVar9 = pIVar9->ParentWindow;
    }
    if (pIVar9 != local_8->NavWindow) {
      pIVar6 = local_8->NavWindow;
      FocusWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      pIVar9->NavLastChildNavWindow = pIVar6;
    }
    if (((local_8->NavWindow->DC).NavLayersActiveMask & 2U) == 0) {
      IVar2 = ImGuiNavLayer_Main;
    }
    else {
      IVar2 = local_8->NavLayer ^ ImGuiNavLayer_Menu;
    }
    if (IVar2 != local_8->NavLayer) {
      if (IVar2 == ImGuiNavLayer_Menu) {
        local_8->NavWindow->NavLastIds[1] = 0;
      }
      NavRestoreLayer((ImGuiNavLayer)in_stack_ffffffffffffff44);
      NavRestoreHighlightAfterMove();
    }
  }
  return;
}

Assistant:

static void ImGui::NavUpdateWindowing()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    ImGuiWindow* apply_focus_window = NULL;
    bool apply_toggle_layer = false;

    ImGuiWindow* modal_window = GetTopMostPopupModal();
    bool allow_windowing = (modal_window == NULL);
    if (!allow_windowing)
        g.NavWindowingTarget = NULL;

    // Fade out
    if (g.NavWindowingTargetAnim && g.NavWindowingTarget == NULL)
    {
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha - io.DeltaTime * 10.0f, 0.0f);
        if (g.DimBgRatio <= 0.0f && g.NavWindowingHighlightAlpha <= 0.0f)
            g.NavWindowingTargetAnim = NULL;
    }

    // Start CTRL+Tab or Square+L/R window selection
    const bool start_windowing_with_gamepad = allow_windowing && !g.NavWindowingTarget && IsNavInputTest(ImGuiNavInput_Menu, ImGuiInputReadMode_Pressed);
    const bool start_windowing_with_keyboard = allow_windowing && !g.NavWindowingTarget && io.KeyCtrl && IsKeyPressed(ImGuiKey_Tab);
    if (start_windowing_with_gamepad || start_windowing_with_keyboard)
        if (ImGuiWindow* window = g.NavWindow ? g.NavWindow : FindWindowNavFocusable(g.WindowsFocusOrder.Size - 1, -INT_MAX, -1))
        {
            g.NavWindowingTarget = g.NavWindowingTargetAnim = window->RootWindow;
            g.NavWindowingTimer = g.NavWindowingHighlightAlpha = 0.0f;
            g.NavWindowingToggleLayer = start_windowing_with_gamepad ? true : false; // Gamepad starts toggling layer
            g.NavInputSource = start_windowing_with_keyboard ? ImGuiInputSource_Keyboard : ImGuiInputSource_Gamepad;
        }

    // Gamepad update
    g.NavWindowingTimer += io.DeltaTime;
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_Gamepad)
    {
        // Highlight only appears after a brief time holding the button, so that a fast tap on PadMenu (to toggle NavLayer) doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingTimer - NAV_WINDOWING_HIGHLIGHT_DELAY) / 0.05f));

        // Select window to focus
        const int focus_change_dir = (int)IsNavInputTest(ImGuiNavInput_FocusPrev, ImGuiInputReadMode_RepeatSlow) - (int)IsNavInputTest(ImGuiNavInput_FocusNext, ImGuiInputReadMode_RepeatSlow);
        if (focus_change_dir != 0)
        {
            NavUpdateWindowingHighlightWindow(focus_change_dir);
            g.NavWindowingHighlightAlpha = 1.0f;
        }

        // Single press toggles NavLayer, long press with L/R apply actual focus on release (until then the window was merely rendered top-most)
        if (!IsNavInputDown(ImGuiNavInput_Menu))
        {
            g.NavWindowingToggleLayer &= (g.NavWindowingHighlightAlpha < 1.0f); // Once button was held long enough we don't consider it a tap-to-toggle-layer press anymore.
            if (g.NavWindowingToggleLayer && g.NavWindow)
                apply_toggle_layer = true;
            else if (!g.NavWindowingToggleLayer)
                apply_focus_window = g.NavWindowingTarget;
            g.NavWindowingTarget = NULL;
        }
    }

    // Keyboard: Focus
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_Keyboard)
    {
        // Visuals only appears after a brief time after pressing TAB the first time, so that a fast CTRL+TAB doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingTimer - NAV_WINDOWING_HIGHLIGHT_DELAY) / 0.05f)); // 1.0f
        if (IsKeyPressed(ImGuiKey_Tab, true))
            NavUpdateWindowingHighlightWindow(io.KeyShift ? +1 : -1);
        if (!io.KeyCtrl)
            apply_focus_window = g.NavWindowingTarget;
    }

    // Keyboard: Press and Release ALT to toggle menu layer
    // - Testing that only Alt is tested prevents Alt+Shift or AltGR from toggling menu layer.
    // - AltGR is normally Alt+Ctrl but we can't reliably detect it (not all backends/systems/layout emit it as Alt+Ctrl). But even on keyboards without AltGR we don't want Alt+Ctrl to open menu anyway.
	const bool nav_keyboard_active = (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) != 0;
    if (nav_keyboard_active && IsKeyPressed(ImGuiKey_ModAlt))
    {
        g.NavWindowingToggleLayer = true;
        g.NavInputSource = ImGuiInputSource_Keyboard;
    }
    if (g.NavWindowingToggleLayer && g.NavInputSource == ImGuiInputSource_Keyboard)
    {
        // We cancel toggling nav layer when any text has been typed (generally while holding Alt). (See #370)
        // We cancel toggling nav layer when other modifiers are pressed. (See #4439)
        if (io.InputQueueCharacters.Size > 0 || io.KeyCtrl || io.KeyShift || io.KeySuper)
            g.NavWindowingToggleLayer = false;

        // Apply layer toggle on release
        // Important: as before version <18314 we lacked an explicit IO event for focus gain/loss, we also compare mouse validity to detect old backends clearing mouse pos on focus loss.
        if (IsKeyReleased(ImGuiKey_ModAlt) && g.NavWindowingToggleLayer)
            if (g.ActiveId == 0 || g.ActiveIdAllowOverlap)
                if (IsMousePosValid(&io.MousePos) == IsMousePosValid(&io.MousePosPrev))
                    apply_toggle_layer = true;
        if (!IsKeyDown(ImGuiKey_ModAlt))
            g.NavWindowingToggleLayer = false;
    }

    // Move window
    if (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoMove))
    {
        ImVec2 move_delta;
        if (g.NavInputSource == ImGuiInputSource_Keyboard && !io.KeyShift)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_RawKeyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_Gamepad)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadLStick, ImGuiInputReadMode_Down);
        if (move_delta.x != 0.0f || move_delta.y != 0.0f)
        {
            const float NAV_MOVE_SPEED = 800.0f;
            const float move_speed = ImFloor(NAV_MOVE_SPEED * io.DeltaTime * ImMin(io.DisplayFramebufferScale.x, io.DisplayFramebufferScale.y)); // FIXME: Doesn't handle variable framerate very well
            ImGuiWindow* moving_window = g.NavWindowingTarget->RootWindow;
            SetWindowPos(moving_window, moving_window->Pos + move_delta * move_speed, ImGuiCond_Always);
            MarkIniSettingsDirty(moving_window);
            g.NavDisableMouseHover = true;
        }
    }

    // Apply final focus
    if (apply_focus_window && (g.NavWindow == NULL || apply_focus_window != g.NavWindow->RootWindow))
    {
        ClearActiveID();
        NavRestoreHighlightAfterMove();
        apply_focus_window = NavRestoreLastChildNavWindow(apply_focus_window);
        ClosePopupsOverWindow(apply_focus_window, false);
        FocusWindow(apply_focus_window);
        if (apply_focus_window->NavLastIds[0] == 0)
            NavInitWindow(apply_focus_window, false);

        // If the window has ONLY a menu layer (no main layer), select it directly
        // Use NavLayersActiveMaskNext since windows didn't have a chance to be Begin()-ed on this frame,
        // so CTRL+Tab where the keys are only held for 1 frame will be able to use correct layers mask since
        // the target window as already been previewed once.
        // FIXME-NAV: This should be done in NavInit.. or in FocusWindow... However in both of those cases,
        // we won't have a guarantee that windows has been visible before and therefore NavLayersActiveMask*
        // won't be valid.
        if (apply_focus_window->DC.NavLayersActiveMaskNext == (1 << ImGuiNavLayer_Menu))
            g.NavLayer = ImGuiNavLayer_Menu;
    }
    if (apply_focus_window)
        g.NavWindowingTarget = NULL;

    // Apply menu/layer toggle
    if (apply_toggle_layer && g.NavWindow)
    {
        ClearActiveID();

        // Move to parent menu if necessary
        ImGuiWindow* new_nav_window = g.NavWindow;
        while (new_nav_window->ParentWindow
            && (new_nav_window->DC.NavLayersActiveMask & (1 << ImGuiNavLayer_Menu)) == 0
            && (new_nav_window->Flags & ImGuiWindowFlags_ChildWindow) != 0
            && (new_nav_window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu)) == 0)
            new_nav_window = new_nav_window->ParentWindow;
        if (new_nav_window != g.NavWindow)
        {
            ImGuiWindow* old_nav_window = g.NavWindow;
            FocusWindow(new_nav_window);
            new_nav_window->NavLastChildNavWindow = old_nav_window;
        }

        // Toggle layer
        const ImGuiNavLayer new_nav_layer = (g.NavWindow->DC.NavLayersActiveMask & (1 << ImGuiNavLayer_Menu)) ? (ImGuiNavLayer)((int)g.NavLayer ^ 1) : ImGuiNavLayer_Main;
        if (new_nav_layer != g.NavLayer)
        {
            // Reinitialize navigation when entering menu bar with the Alt key (FIXME: could be a properly of the layer?)
            if (new_nav_layer == ImGuiNavLayer_Menu)
                g.NavWindow->NavLastIds[new_nav_layer] = 0;
            NavRestoreLayer(new_nav_layer);
            NavRestoreHighlightAfterMove();
        }
    }
}